

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff_imod_chunk.cpp
# Opt level: O2

ostream * sf2cute::SFRIFFImodChunk::WriteItem
                    (ostream *out,SFModulator source_op,SFGenerator destination_op,int16_t amount,
                    SFModulator amount_source_op,SFTransform transform_op)

{
  uint16_t uVar1;
  undefined3 in_register_00000089;
  SFModulator local_38;
  SFModulator local_30;
  
  local_30._0_4_ = source_op._0_4_;
  local_30.type_ = source_op.type_;
  local_38._0_4_ = amount_source_op._0_4_;
  local_38.type_ = amount_source_op.type_;
  uVar1 = SFModulator::operator_cast_to_unsigned_short(&local_30);
  InsertInt16L<std::ostream>(out,uVar1);
  InsertInt16L<std::ostream>(out,destination_op);
  InsertInt16L<std::ostream>(out,amount);
  uVar1 = SFModulator::operator_cast_to_unsigned_short(&local_38);
  InsertInt16L<std::ostream>(out,uVar1);
  InsertInt16L<std::ostream>(out,(uint16_t)CONCAT31(in_register_00000089,transform_op));
  return out;
}

Assistant:

std::ostream & SFRIFFImodChunk::WriteItem(std::ostream & out,
    SFModulator source_op,
    SFGenerator destination_op,
    int16_t amount,
    SFModulator amount_source_op,
    SFTransform transform_op) {
  // struct sfInstModList:
  // SFModulator sfModSrcOper;
  InsertInt16L(out, uint16_t(source_op));

  // SFGenerator sfModDestOper;
  InsertInt16L(out, uint16_t(destination_op));

  // int16_t modAmount;
  InsertInt16L(out, amount);

  // SFModulator sfModAmtSrcOper;
  InsertInt16L(out, uint16_t(amount_source_op));

  // SFTransform sfModTransOper;
  InsertInt16L(out, uint16_t(transform_op));

  return out;
}